

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::QualifierOrderFunctionOutputTest::prepareShaderSource
          (QualifierOrderFunctionOutputTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  TestError *this_00;
  ulong uVar2;
  qualifierSet *qualifiers;
  char *pcVar3;
  GLchar *in_R8;
  char *pcVar4;
  size_t position;
  size_t local_78;
  string local_70;
  string local_50;
  
  switch(in_stage) {
  case COMPUTE_SHADER:
    goto switchD_009f148e_caseD_0;
  case VERTEX_SHADER:
    pcVar4 = 
    "VERSION\n\nout vec4 vs_tcs_result;\n\nuniform vec4 VARIABLE_NAME;\n\nFUNCTION_DECLARATION\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION\n    vs_tcs_result = result;\n}\n\n"
    ;
    break;
  case TESS_CTRL_SHADER:
    pcVar4 = 
    "VERSION\n\nlayout(vertices = 1) out;\n\nin  vec4 vs_tcs_result[];\nout vec4 tcs_tes_result[];\n\nuniform vec4 VARIABLE_NAME;\n\nFUNCTION_DECLARATION\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tcs_tes_result[gl_InvocationID] = result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n}\n\n"
    ;
    break;
  case TESS_EVAL_SHADER:
    pcVar4 = 
    "VERSION\n\nlayout(isolines, point_mode) in;\n\nin  vec4 tcs_tes_result[];\nout vec4 tes_gs_result;\n\nuniform vec4 VARIABLE_NAME;\n\nFUNCTION_DECLARATION\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    tes_gs_result = result;\n}\n\n"
    ;
    break;
  case GEOMETRY_SHADER:
    pcVar4 = 
    "VERSION\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nin  vec4 tes_gs_result[];\nout vec4 gs_fs_result;\n\nuniform vec4 VARIABLE_NAME;\n\nFUNCTION_DECLARATION\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    gs_fs_result = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs_result = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
    break;
  case FRAGMENT_SHADER:
    pcVar4 = 
    "VERSION\n\nin  vec4 gs_fs_result;\nout vec4 fs_out_result;\n\nuniform vec4 VARIABLE_NAME;\n\nFUNCTION_DECLARATION\n\nvoid main()\n{\n    vec4 result = vec4(0, 1, 0, 1);\n\nVERIFICATION    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n    {\n         result = vec4(1, 0, 0, 1);\n    }\n\n    fs_out_result = result;\n}\n\n"
    ;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x1ddb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  Utils::getVariableName_abi_cxx11_
            (&local_50,(Utils *)(ulong)in_stage,TESS_CTRL_SHADER,0x1be63f5,in_R8);
  uVar2 = 0;
  if (this->m_current_test_case_index != 0xffffffff) {
    uVar2 = (ulong)this->m_current_test_case_index;
  }
  Utils::getQualifiersListString_abi_cxx11_
            (&local_70,
             (Utils *)((this->m_test_cases).
                       super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar2),qualifiers);
  psVar1 = (out_source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (char *)(psVar1->m_code)._M_string_length;
  strlen(pcVar4);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)pcVar4);
  local_78 = 0;
  pcVar4 = "#version 420";
  if (in_use_version_400) {
    pcVar4 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  pcVar3 = "#version 430";
  if (in_stage != COMPUTE_SHADER) {
    pcVar3 = pcVar4;
  }
  Utils::replaceToken("VERSION",&local_78,pcVar3,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("FUNCTION_DECLARATION",&local_78,
                      "void function(QUALIFIERS_LIST vec4 param)\n{\n    param = VARIABLE_NAME.wzyx;\n}\n"
                      ,&((out_source->m_parts).
                         super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_code);
  local_78 = local_78 - 0x4e;
  Utils::replaceToken("QUALIFIERS_LIST",&local_78,local_70._M_dataplus._M_p,
                      &((out_source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceToken("VERIFICATION",&local_78,
                      "    vec4 temp;\n\n    function(temp);\n\n    vec4 diff = temp - vec4(0, 0, 1, 1);\n    if (false == all(lessThan(diff, vec4(0.001, 0.001, 0.001, 0.001))))\n    {\n        result = VARIABLE_NAME;\n    }\n"
                      ,&((out_source->m_parts).
                         super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_code);
  Utils::replaceAllTokens
            ("VARIABLE_NAME",local_50._M_dataplus._M_p,
             &((out_source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
switchD_009f148e_caseD_0:
  return;
}

Assistant:

void QualifierOrderFunctionOutputTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
														   Utils::shaderSource& out_source)
{
	static const GLchar* verification_snippet =
		"    vec4 temp;\n"
		"\n"
		"    function(temp);\n"
		"\n"
		"    vec4 diff = temp - vec4(0, 0, 1, 1);\n"
		"    if (false == all(lessThan(diff, vec4(0.001, 0.001, 0.001, 0.001))))\n"
		"    {\n"
		"        result = VARIABLE_NAME;\n"
		"    }\n";

	static const GLchar* function_declaration = "void function(QUALIFIERS_LIST vec4 param)\n"
												"{\n"
												"    param = VARIABLE_NAME.wzyx;\n"
												"}\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"uniform vec4 VARIABLE_NAME;\n"
													"\n"
													"FUNCTION_DECLARATION\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"uniform vec4 VARIABLE_NAME;\n"
													"\n"
													"FUNCTION_DECLARATION\n"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"uniform vec4 VARIABLE_NAME;\n"
		"\n"
		"FUNCTION_DECLARATION\n"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "uniform vec4 VARIABLE_NAME;\n"
													 "\n"
													 "FUNCTION_DECLARATION\n"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "uniform vec4 VARIABLE_NAME;\n"
												  "\n"
												  "FUNCTION_DECLARATION\n"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		return;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	const std::string& uni_reference  = Utils::getVariableName(in_stage, Utils::UNIFORM, "test");
	const std::string& qualifier_list = Utils::getQualifiersListString(getCurrentTestCase());

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;

	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("FUNCTION_DECLARATION", position, function_declaration, out_source.m_parts[0].m_code);

	position -= strlen(function_declaration);

	Utils::replaceToken("QUALIFIERS_LIST", position, qualifier_list.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("VARIABLE_NAME", uni_reference.c_str(), out_source.m_parts[0].m_code);
}